

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglQueryConfigTests.cpp
# Opt level: O3

void deqp::egl::logConfigAttribute(TestLog *log,EGLenum attrib,EGLint value)

{
  char *__s;
  size_t sVar1;
  ConfigAttribValueFmt local_1a8;
  undefined1 local_1a0 [8];
  _func_int **local_198;
  ios_base local_128 [264];
  
  local_1a0 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_198);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,"  ",2);
  __s = eglu::getConfigAttribName(attrib);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_198 + (int)local_198[-3]);
  }
  else {
    sVar1 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,__s,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198,": ",2);
  local_1a8.value = value;
  local_1a8.attribute = attrib;
  eglu::operator<<((ostream *)&local_198,&local_1a8);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  return;
}

Assistant:

static void logConfigAttribute (TestLog& log, EGLenum attrib, EGLint value)
{
	log << TestLog::Message << "  " << eglu::getConfigAttribName(attrib) << ": " << eglu::getConfigAttribValueStr(attrib, value) << TestLog::EndMessage;
}